

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O0

void __thiscall
sptk::FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
          (FilterCoefficientsToSpectrum *this,int num_numerator_order,int num_denominator_order,
          int fft_length,InputOutputFormats output_format,double epsilon,
          double relative_floor_in_decibels)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double in_stack_00000058;
  InputOutputFormats in_stack_00000064;
  InputOutputFormats in_stack_00000068;
  int in_stack_0000006c;
  SpectrumToSpectrum *in_stack_00000070;
  int in_stack_ffffffffffffffac;
  
  *in_RDI = &PTR__FilterCoefficientsToSpectrum_001328a0;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            ((RealValuedFastFourierTransform *)(in_RDI + 3),in_stack_ffffffffffffffac);
  SpectrumToSpectrum::SpectrumToSpectrum
            (in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000064,
             in_stack_00000058,(double)this);
  *(undefined1 *)(in_RDI + 0x19) = 1;
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 0)) ||
      (*(int *)(in_RDI + 2) <= *(int *)(in_RDI + 1))) ||
     (((*(int *)(in_RDI + 2) <= *(int *)((long)in_RDI + 0xc) ||
       (bVar1 = RealValuedFastFourierTransform::IsValid
                          ((RealValuedFastFourierTransform *)(in_RDI + 3)), !bVar1)) ||
      (bVar1 = SpectrumToSpectrum::IsValid((SpectrumToSpectrum *)(in_RDI + 0x10)), !bVar1)))) {
    *(undefined1 *)(in_RDI + 0x19) = 0;
  }
  return;
}

Assistant:

FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum(
    int num_numerator_order, int num_denominator_order, int fft_length,
    SpectrumToSpectrum::InputOutputFormats output_format, double epsilon,
    double relative_floor_in_decibels)
    : num_numerator_order_(num_numerator_order),
      num_denominator_order_(num_denominator_order),
      fft_length_(fft_length),
      fast_fourier_transform_(fft_length_),
      spectrum_to_spectrum_(fft_length_, SpectrumToSpectrum::kPowerSpectrum,
                            output_format, epsilon, relative_floor_in_decibels),
      is_valid_(true) {
  if (num_numerator_order_ < 0 || num_denominator_order_ < 0 ||
      fft_length_ <= num_numerator_order_ ||
      fft_length_ <= num_denominator_order_ ||
      !fast_fourier_transform_.IsValid() || !spectrum_to_spectrum_.IsValid()) {
    is_valid_ = false;
  }
}